

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O0

bool __thiscall QFileDevice::flush(QFileDevice *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  QFileDevicePrivate *this_00;
  void *pvVar5;
  pointer pQVar6;
  char *pcVar7;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  FileError err_1;
  FileError err;
  qint64 written;
  qint64 size;
  QFileDevicePrivate *d;
  FileError in_stack_ffffffffffffff4c;
  QFileDevicePrivate *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  FileError local_88;
  bool local_59;
  void *__ptr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFileDevice *)0x12420b);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x124221);
  if (bVar2) {
    bVar2 = QIODevicePrivate::QRingBufferRef::isEmpty((QRingBufferRef *)in_stack_ffffffffffffff50);
    if (!bVar2) {
      pvVar5 = (void *)QIODevicePrivate::QRingBufferRef::nextDataBlockSize
                                 ((QRingBufferRef *)in_stack_ffffffffffffff50);
      pQVar6 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
               operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                           *)0x124298);
      pcVar7 = QIODevicePrivate::QRingBufferRef::readPointer
                         ((QRingBufferRef *)in_stack_ffffffffffffff50);
      iVar3 = (*pQVar6->_vptr_QAbstractFileEngine[0x25])(pQVar6,pcVar7,pvVar5);
      __ptr = (void *)CONCAT44(extraout_var,iVar3);
      if (0 < (long)__ptr) {
        QIODevicePrivate::QRingBufferRef::free(&(this_00->super_QIODevicePrivate).writeBuffer,__ptr)
        ;
      }
      if (__ptr != pvVar5) {
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x124302);
        QAbstractFileEngine::error((QAbstractFileEngine *)in_stack_ffffffffffffff50);
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x124340);
        QAbstractFileEngine::errorString
                  ((QAbstractFileEngine *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        QFileDevicePrivate::setError
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,(QString *)0x124360);
        QString::~QString((QString *)0x12436a);
        local_59 = false;
        goto LAB_0012441d;
      }
    }
    pQVar6 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x124387);
    uVar4 = (*pQVar6->_vptr_QAbstractFileEngine[4])();
    if ((uVar4 & 1) == 0) {
      std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                 0x1243a9);
      local_88 = QAbstractFileEngine::error((QAbstractFileEngine *)in_stack_ffffffffffffff50);
      if (local_88 == UnspecifiedError) {
        local_88 = WriteError;
      }
      std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                 0x1243e7);
      QAbstractFileEngine::errorString
                ((QAbstractFileEngine *)CONCAT44(local_88,in_stack_ffffffffffffff58));
      QFileDevicePrivate::setError(this_00,in_stack_ffffffffffffff4c,(QString *)0x124407);
      QString::~QString((QString *)0x124411);
      local_59 = false;
    }
    else {
      local_59 = true;
    }
  }
  else {
    local_59 = false;
  }
LAB_0012441d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_59;
}

Assistant:

bool QFileDevice::flush()
{
    Q_D(QFileDevice);
    if (!d->fileEngine) {
        qWarning("QFileDevice::flush: No file engine. Is IODevice open?");
        return false;
    }

    if (!d->writeBuffer.isEmpty()) {
        qint64 size = d->writeBuffer.nextDataBlockSize();
        qint64 written = d->fileEngine->write(d->writeBuffer.readPointer(), size);
        if (written > 0)
            d->writeBuffer.free(written);
        if (written != size) {
            QFileDevice::FileError err = d->fileEngine->error();
            if (err == QFileDevice::UnspecifiedError)
                err = QFileDevice::WriteError;
            d->setError(err, d->fileEngine->errorString());
            return false;
        }
    }

    if (!d->fileEngine->flush()) {
        QFileDevice::FileError err = d->fileEngine->error();
        if (err == QFileDevice::UnspecifiedError)
            err = QFileDevice::WriteError;
        d->setError(err, d->fileEngine->errorString());
        return false;
    }
    return true;
}